

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.cpp
# Opt level: O0

void __thiscall Assimp::FBX::Node::DumpChildrenAscii(Node *this,ostream *s,int indent)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  ulong local_28;
  size_t i;
  int indent_local;
  ostream *s_local;
  Node *this_local;
  
  sVar2 = std::vector<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>::size(&this->children);
  if ((sVar2 != 0) || ((this->force_has_children & 1U) != 0)) {
    for (local_28 = 0;
        sVar2 = std::vector<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>::size
                          (&this->children), local_28 < sVar2; local_28 = local_28 + 1) {
      pvVar3 = std::vector<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>::operator[]
                         (&this->children,local_28);
      bVar1 = std::operator==(&pvVar3->name,"EncryptionType");
      if (!bVar1) {
        pvVar3 = std::vector<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>::operator[]
                           (&this->children,local_28);
        DumpAscii(pvVar3,s,indent);
      }
    }
  }
  return;
}

Assistant:

void FBX::Node::DumpChildrenAscii(std::ostream& s, int indent)
{
    // children will need a lot of padding and corralling
    if (children.size() || force_has_children) {
        for (size_t i = 0; i < children.size(); ++i) {
            // no compression in ascii files, so skip this node if it exists
            if (children[i].name == "EncryptionType") { continue; }
            // the child can dump itself
            children[i].DumpAscii(s, indent);
        }
    }
}